

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

int mbedtls_sha512_ret(uchar *input,size_t ilen,uchar *output,int is384)

{
  long lVar1;
  mbedtls_sha512_context local_100;
  
  memset(&local_100,0,0xd8);
  if (is384 == 0) {
    local_100.state[6]._0_4_ = 0xfb41bd6b;
    local_100.state[6]._4_4_ = 0x1f83d9ab;
    local_100.state[7]._0_4_ = 0x137e2179;
    local_100.state[7]._4_4_ = 0x5be0cd19;
    local_100.state[4]._0_4_ = 0xade682d1;
    local_100.state[4]._4_4_ = 0x510e527f;
    local_100.state[5]._0_4_ = 0x2b3e6c1f;
    local_100.state[5]._4_4_ = 0x9b05688c;
    local_100.state[2]._0_4_ = 0xfe94f82b;
    local_100.state[2]._4_4_ = 0x3c6ef372;
    local_100.state[3]._0_4_ = 0x5f1d36f1;
    local_100.state[3]._4_4_ = 0xa54ff53a;
    local_100.state[0]._0_4_ = 0xf3bcc908;
    local_100.state[0]._4_4_ = 0x6a09e667;
    local_100.state[1]._0_4_ = 0x84caa73b;
    local_100.state[1]._4_4_ = 0xbb67ae85;
  }
  else {
    local_100.state[6]._0_4_ = 0x64f98fa7;
    local_100.state[6]._4_4_ = 0xdb0c2e0d;
    local_100.state[7]._0_4_ = 0xbefa4fa4;
    local_100.state[7]._4_4_ = 0x47b5481d;
    local_100.state[4]._0_4_ = 0xffc00b31;
    local_100.state[4]._4_4_ = 0x67332667;
    local_100.state[5]._0_4_ = 0x68581511;
    local_100.state[5]._4_4_ = 0x8eb44a87;
    local_100.state[2]._0_4_ = 0x3070dd17;
    local_100.state[2]._4_4_ = 0x9159015a;
    local_100.state[3]._0_4_ = 0xf70e5939;
    local_100.state[3]._4_4_ = 0x152fecd8;
    local_100.state[0]._0_4_ = 0xc1059ed8;
    local_100.state[0]._4_4_ = 0xcbbb9d5d;
    local_100.state[1]._0_4_ = 0x367cd507;
    local_100.state[1]._4_4_ = 0x629a292a;
  }
  local_100.is384 = is384;
  mbedtls_sha512_update_ret(&local_100,input,ilen);
  mbedtls_sha512_finish_ret(&local_100,output);
  lVar1 = 0;
  do {
    *(undefined1 *)((long)local_100.total + lVar1) = 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xd8);
  return 0;
}

Assistant:

int mbedtls_sha512_ret( const unsigned char *input,
                    size_t ilen,
                    unsigned char output[64],
                    int is384 )
{
    int ret;
    mbedtls_sha512_context ctx;

    mbedtls_sha512_init( &ctx );

    if( ( ret = mbedtls_sha512_starts_ret( &ctx, is384 ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_sha512_update_ret( &ctx, input, ilen ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_sha512_finish_ret( &ctx, output ) ) != 0 )
        goto exit;

exit:
    mbedtls_sha512_free( &ctx );

    return( ret );
}